

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplerate.c
# Opt level: O0

char * src_strerror(int error)

{
  char *pcStack_10;
  int error_local;
  
  switch(error) {
  case 0:
    pcStack_10 = "No error.";
    break;
  case 1:
    pcStack_10 = "Malloc failed.";
    break;
  case 2:
    pcStack_10 = "SRC_STATE pointer is NULL.";
    break;
  case 3:
    pcStack_10 = "SRC_DATA pointer is NULL.";
    break;
  case 4:
    pcStack_10 = "SRC_DATA->data_out or SRC_DATA->data_in is NULL.";
    break;
  case 5:
    pcStack_10 = "Internal error. No private data.";
    break;
  case 6:
    pcStack_10 = "SRC ratio outside [1/256, 256] range.";
    break;
  case 7:
    pcStack_10 = "Internal error. No process pointer.";
    break;
  case 8:
    pcStack_10 = "Internal error. SHIFT_BITS too large.";
    break;
  case 9:
    pcStack_10 = "Internal error. Filter length too large.";
    break;
  case 10:
    pcStack_10 = "Bad converter number.";
    break;
  case 0xb:
    pcStack_10 = "Channel count must be >= 1.";
    break;
  case 0xc:
    pcStack_10 = "Internal error. Bad buffer length. Please report this.";
    break;
  case 0xd:
    pcStack_10 = "Internal error. Input data / internal buffer size difference. Please report this."
    ;
    break;
  case 0xe:
    pcStack_10 = "Internal error. Private pointer is NULL. Please report this.";
    break;
  case 0xf:
    pcStack_10 = "src_process() called without reset after end_of_input.";
    break;
  case 0x10:
    pcStack_10 = "Input and output data arrays overlap.";
    break;
  case 0x11:
    pcStack_10 = "Supplied callback function pointer is NULL.";
    break;
  case 0x12:
    pcStack_10 = "Calling mode differs from initialisation mode (ie process v callback).";
    break;
  case 0x13:
    pcStack_10 = "Callback function pointer is NULL in src_callback_read ().";
    break;
  case 0x14:
    pcStack_10 = "This converter only allows constant conversion ratios.";
    break;
  case 0x15:
    pcStack_10 = "Internal error : Bad length in prepare_data ().";
    break;
  case 0x16:
    pcStack_10 = "Error : Someone is trampling on my internal state.";
    break;
  case 0x17:
    pcStack_10 = "Placeholder. No error defined for this error number.";
    break;
  default:
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

const char*
src_strerror (int error)
{
	switch (error)
	{	case SRC_ERR_NO_ERROR :
				return "No error." ;
		case SRC_ERR_MALLOC_FAILED :
				return "Malloc failed." ;
		case SRC_ERR_BAD_STATE :
				return "SRC_STATE pointer is NULL." ;
		case SRC_ERR_BAD_DATA :
				return "SRC_DATA pointer is NULL." ;
		case SRC_ERR_BAD_DATA_PTR :
				return "SRC_DATA->data_out or SRC_DATA->data_in is NULL." ;
		case SRC_ERR_NO_PRIVATE :
				return "Internal error. No private data." ;

		case SRC_ERR_BAD_SRC_RATIO :
				return "SRC ratio outside [1/" SRC_MAX_RATIO_STR ", " SRC_MAX_RATIO_STR "] range." ;

		case SRC_ERR_BAD_SINC_STATE :
				return "src_process() called without reset after end_of_input." ;
		case SRC_ERR_BAD_PROC_PTR :
				return "Internal error. No process pointer." ;
		case SRC_ERR_SHIFT_BITS :
				return "Internal error. SHIFT_BITS too large." ;
		case SRC_ERR_FILTER_LEN :
				return "Internal error. Filter length too large." ;
		case SRC_ERR_BAD_CONVERTER :
				return "Bad converter number." ;
		case SRC_ERR_BAD_CHANNEL_COUNT :
				return "Channel count must be >= 1." ;
		case SRC_ERR_SINC_BAD_BUFFER_LEN :
				return "Internal error. Bad buffer length. Please report this." ;
		case SRC_ERR_SIZE_INCOMPATIBILITY :
				return "Internal error. Input data / internal buffer size difference. Please report this." ;
		case SRC_ERR_BAD_PRIV_PTR :
				return "Internal error. Private pointer is NULL. Please report this." ;
		case SRC_ERR_DATA_OVERLAP :
				return "Input and output data arrays overlap." ;
		case SRC_ERR_BAD_CALLBACK :
				return "Supplied callback function pointer is NULL." ;
		case SRC_ERR_BAD_MODE :
				return "Calling mode differs from initialisation mode (ie process v callback)." ;
		case SRC_ERR_NULL_CALLBACK :
				return "Callback function pointer is NULL in src_callback_read ()." ;
		case SRC_ERR_NO_VARIABLE_RATIO :
				return "This converter only allows constant conversion ratios." ;
		case SRC_ERR_SINC_PREPARE_DATA_BAD_LEN :
				return "Internal error : Bad length in prepare_data ()." ;
		case SRC_ERR_BAD_INTERNAL_STATE :
				return "Error : Someone is trampling on my internal state." ;

		case SRC_ERR_MAX_ERROR :
				return "Placeholder. No error defined for this error number." ;

		default : 						break ;
		}

	return NULL ;
}